

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O0

_Bool adt_str_equal_cstr(adt_str_t *self,char *cstr)

{
  uint8_t d;
  uint8_t c;
  uint8_t *pEnd;
  uint8_t *pNext;
  uint8_t *pStr;
  char *cstr_local;
  adt_str_t *self_local;
  
  if ((self != (adt_str_t *)0x0) && (cstr != (char *)0x0)) {
    if ((*cstr == '\0') && (self->s32Cur == 0)) {
      return true;
    }
    if ((0 < self->s32Cur) && (self->pAlloc != (uint8_t *)0x0)) {
      pEnd = self->pAlloc;
      for (pNext = (uint8_t *)cstr;
          ((pEnd < self->pAlloc + self->s32Cur && (*pEnd == *pNext)) && (*pNext != '\0'));
          pNext = pNext + 1) {
        pEnd = pEnd + 1;
      }
      if ((*pNext == '\0') && (pEnd == self->pAlloc + self->s32Cur)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool adt_str_equal_cstr(const adt_str_t *self, const char *cstr)
{
   if ( (self != 0) && (cstr != 0))
   {
      if ( (*cstr == 0) && (self->s32Cur == 0) )
      {
         return true;
      }
      else if (self->s32Cur > 0 && self->pAlloc != 0)
      {
         const uint8_t *pStr = (const uint8_t*) cstr;
         const uint8_t *pNext = self->pAlloc;
         const uint8_t *pEnd = self->pAlloc + self->s32Cur;
         while(pNext < pEnd)
         {
            uint8_t c = *pNext;
            uint8_t d = *pStr;
            if ( (c != d) || (d == 0) )
            {
               break;
            }
            ++pNext;
            ++pStr;
         }
         if ( (*pStr == 0) && (pNext == pEnd) )
         {
            return true;
         }
      }
   }
   return false;
}